

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::handle
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,LeafData *ld,
          bool doInsert)

{
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *pDVar1;
  byte in_DL;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *in_RDI;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  bindings;
  Literal *norm;
  LeafData *in_stack_00000410;
  BindingMap *in_stack_00000418;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *in_stack_00000420;
  Rhs *in_stack_ffffffffffffff28;
  Rhs *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  Literal *in_stack_ffffffffffffff68;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *in_stack_ffffffffffffff70;
  anon_class_16_2_6aee48c9 in_stack_ffffffffffffff78;
  
  Inferences::ALASCA::BinaryResolutionConf::Rhs::key((Rhs *)0x465251);
  Kernel::Renaming::normalize
            ((Literal *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_ffffffffffffff30);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::handle(Inferences::ALASCA::BinaryResolutionConf::Rhs,bool)::_lambda(int,auto:1)_1_>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67,
             in_stack_ffffffffffffff78);
  if ((in_DL & 1) == 0) {
    pDVar1 = Lib::
             Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x46534c);
    Inferences::ALASCA::BinaryResolutionConf::Rhs::Rhs(in_stack_ffffffffffffff30,(Rhs *)pDVar1);
    remove(in_RDI,(char *)pDVar1);
    Inferences::ALASCA::BinaryResolutionConf::Rhs::~Rhs((Rhs *)0x465382);
  }
  else {
    pDVar1 = Lib::
             Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x4652c9);
    Inferences::ALASCA::BinaryResolutionConf::Rhs::Rhs((Rhs *)pDVar1,in_stack_ffffffffffffff28);
    insert(in_stack_00000420,in_stack_00000418,in_stack_00000410);
    Inferences::ALASCA::BinaryResolutionConf::Rhs::~Rhs((Rhs *)0x465301);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void handle(LeafData ld, bool doInsert)
    {
      auto norm = Renaming::normalize(ld.key());
      Recycled<BindingMap> bindings;
      createBindings(norm, /* reversed */ false,
          [&](int var, auto term) { 
            _nextVar = std::max(_nextVar, var + 1);
            bindings->insert(var, term);
          });
      if (doInsert) insert(*bindings, ld);
      else          remove(*bindings, ld);
    }